

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O2

bool __thiscall
cmSourceGroupCommand::InitialPass
          (cmSourceGroupCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  cmCommand *this_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  cmSourceGroup *this_01;
  ostream *poVar7;
  uint uVar8;
  ulong uVar9;
  allocator local_231;
  cmCommand *local_230;
  cmSourceGroup *local_228;
  string local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  folders;
  string delimiter;
  string src;
  string local_50;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string
              ((string *)&src,"called with incorrect number of arguments",(allocator *)&delimiter);
    cmCommand::SetError(&this->super_cmCommand,&src);
    std::__cxx11::string::~string((string *)&src);
    return false;
  }
  std::__cxx11::string::string((string *)&delimiter,"\\",(allocator *)&src);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&src,"SOURCE_GROUP_DELIMITER",(allocator *)&local_220);
  pcVar6 = cmMakefile::GetDefinition(pcVar1,&src);
  std::__cxx11::string::~string((string *)&src);
  if (pcVar6 != (char *)0x0) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&src,"SOURCE_GROUP_DELIMITER",(allocator *)&local_220);
    cmMakefile::GetDefinition(pcVar1,&src);
    std::__cxx11::string::assign((char *)&delimiter);
    std::__cxx11::string::~string((string *)&src);
  }
  cmSystemTools::tokenize
            (&folders,(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,&delimiter);
  this_01 = cmMakefile::GetSourceGroup((this->super_cmCommand).Makefile,&folders);
  if (this_01 == (cmSourceGroup *)0x0) {
    cmMakefile::AddSourceGroup((this->super_cmCommand).Makefile,&folders,(char *)0x0);
    this_01 = cmMakefile::GetSourceGroup((this->super_cmCommand).Makefile,&folders);
    if (this_01 == (cmSourceGroup *)0x0) {
      std::__cxx11::string::string
                ((string *)&src,"Could not create or find source group",(allocator *)&local_220);
      cmCommand::SetError(&this->super_cmCommand,&src);
LAB_002e0334:
      std::__cxx11::string::~string((string *)&src);
LAB_002e03d3:
      bVar3 = false;
      goto LAB_002e03d5;
    }
  }
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((long)(args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 == 0x40) &&
     (bVar3 = std::operator!=(pbVar2 + 1,"FILES"), bVar3)) {
    bVar3 = true;
    cmSourceGroup::SetGroupRegex
              (this_01,(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
  }
  else {
    uVar8 = 1;
    bVar3 = false;
    local_230 = &this->super_cmCommand;
    local_228 = this_01;
    while( true ) {
      uVar9 = (ulong)uVar8;
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar9)
      break;
      bVar4 = std::operator==(pbVar2 + uVar9,"REGULAR_EXPRESSION");
      if (bVar4) {
        uVar8 = uVar8 + 1;
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <=
            (ulong)uVar8) {
          std::__cxx11::string::string
                    ((string *)&src,"REGULAR_EXPRESSION argument given without a regex.",
                     (allocator *)&local_220);
          cmCommand::SetError(local_230,&src);
          goto LAB_002e0334;
        }
        cmSourceGroup::SetGroupRegex(local_228,pbVar2[uVar8]._M_dataplus._M_p);
      }
      else {
        bVar5 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar9,"FILES");
        if (!bVar5) {
          if (!bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
            poVar7 = std::operator<<((ostream *)&src,"Unknown argument \"");
            this_00 = local_230;
            poVar7 = std::operator<<(poVar7,(string *)
                                            ((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + uVar9));
            poVar7 = std::operator<<(poVar7,"\".  ");
            std::operator<<(poVar7,"Perhaps the FILES keyword is missing.\n");
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(this_00,&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
            goto LAB_002e03d3;
          }
          std::__cxx11::string::string
                    ((string *)&src,
                     (string *)
                     ((args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar9));
          bVar3 = cmsys::SystemTools::FileIsFullPath(src._M_dataplus._M_p);
          if (!bVar3) {
            cmMakefile::GetCurrentSourceDirectory(local_230->Makefile);
            std::__cxx11::string::assign((char *)&src);
            std::__cxx11::string::append((char *)&src);
            std::__cxx11::string::append((string *)&src);
          }
          std::__cxx11::string::string((string *)&local_50,src._M_dataplus._M_p,&local_231);
          cmsys::SystemTools::CollapseFullPath(&local_220,&local_50);
          std::__cxx11::string::operator=((string *)&src,(string *)&local_220);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&local_50);
          cmSourceGroup::AddGroupFile(local_228,&src);
          std::__cxx11::string::~string((string *)&src);
        }
      }
      bVar3 = !bVar4;
      uVar8 = uVar8 + 1;
    }
    bVar3 = true;
  }
LAB_002e03d5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&folders);
  std::__cxx11::string::~string((string *)&delimiter);
  return bVar3;
}

Assistant:

bool cmSourceGroupCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string delimiter = "\\";
  if(this->Makefile->GetDefinition("SOURCE_GROUP_DELIMITER"))
    {
    delimiter = this->Makefile->GetDefinition("SOURCE_GROUP_DELIMITER");
    }

  std::vector<std::string> folders =
    cmSystemTools::tokenize(args[0], delimiter);

  cmSourceGroup* sg = 0;
  sg = this->Makefile->GetSourceGroup(folders);
  if(!sg)
    {
    this->Makefile->AddSourceGroup(folders);
    sg = this->Makefile->GetSourceGroup(folders);
    }

  if(!sg)
    {
    this->SetError("Could not create or find source group");
    return false;
    }
  // If only two arguments are given, the pre-1.8 version of the
  // command is being invoked.
  if(args.size() == 2  && args[1] != "FILES")
    {
    sg->SetGroupRegex(args[1].c_str());
    return true;
    }

  // Process arguments.
  bool doingFiles = false;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "REGULAR_EXPRESSION")
      {
      // Next argument must specify the regex.
      if(i+1 < args.size())
        {
        ++i;
        sg->SetGroupRegex(args[i].c_str());
        }
      else
        {
        this->SetError("REGULAR_EXPRESSION argument given without a regex.");
        return false;
        }
      doingFiles = false;
      }
    else if(args[i] == "FILES")
      {
      // Next arguments will specify files.
      doingFiles = true;
      }
    else if(doingFiles)
      {
      // Convert name to full path and add to the group's list.
      std::string src = args[i];
      if(!cmSystemTools::FileIsFullPath(src.c_str()))
        {
        src = this->Makefile->GetCurrentSourceDirectory();
        src += "/";
        src += args[i];
        }
      src = cmSystemTools::CollapseFullPath(src.c_str());
      sg->AddGroupFile(src);
      }
    else
      {
      std::ostringstream err;
      err << "Unknown argument \"" << args[i] << "\".  "
          << "Perhaps the FILES keyword is missing.\n";
      this->SetError(err.str());
      return false;
      }
    }

  return true;
}